

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

bool __thiscall Spi::config_spi(Spi *this)

{
  int iVar1;
  DWORD dwNumBytesSent;
  BYTE byOutputBuffer [64];
  undefined4 local_4c;
  undefined2 local_48;
  undefined1 local_46;
  
  local_4c = 0;
  local_48 = 0x978a;
  local_46 = 0x8d;
  iVar1 = FT_Write(this->ftHandle,&local_48,3);
  if (iVar1 == 0) {
    local_48 = 0x80;
    local_46 = 0xbb;
    iVar1 = FT_Write(this->ftHandle,&local_48,3,&local_4c);
    if (iVar1 == 0) {
      local_48 = 0x82;
      local_46 = 0;
      iVar1 = FT_Write(this->ftHandle,&local_48,3,&local_4c);
      if (iVar1 == 0) {
        local_48 = 0x86;
        local_46 = 0;
        iVar1 = FT_Write(this->ftHandle,&local_48,3,&local_4c);
        if (iVar1 == 0) {
          local_48 = CONCAT11(local_48._1_1_,0x85);
          iVar1 = FT_Write(this->ftHandle,&local_48,1,&local_4c);
          return iVar1 == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Spi::config_spi() {
	FT_STATUS ftStatus;
	BYTE byOutputBuffer[64]; // Buffer to hold MPSSE commands and data to be sent to the FT2232H
	DWORD dwNumBytesToSend = 0; // Index to the output buffer
	DWORD dwNumBytesSent = 0; // Count of actual bytes sent - used with FT_Write
	DWORD dwClockDivisor = 0x0; // Value of clock divisor, SCL Frequency = 60/((1+0x0)*2) (MHz) = 30MHz
	// -----------------------------------------------------------
	// Configure the MPSSE settings for SPI
	// Multiple commands can be sent to the MPSSE with one FT_Write
	// -----------------------------------------------------------
	dwNumBytesToSend = 0; // Start with a fresh index
	// Set up the Hi-Speed specific commands for the FTx232H
	byOutputBuffer[dwNumBytesToSend++] = 0x8A;
	// Use 60MHz master clock (disable divide by 5)
	byOutputBuffer[dwNumBytesToSend++] = 0x97;
	// Turn off adaptive clocking (may be needed for ARM)
	byOutputBuffer[dwNumBytesToSend++] = 0x8D;
	// Disable three-phase clocking
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the HS-specific commands

	if (ftStatus != FT_OK)
		return false;

	dwNumBytesToSend = 0; // Reset output buffer pointer
	// Set initial states of the MPSSE interface - low byte, both pin directions and output values
	// Pin name Signal Direction Config Initial State Config
	// ADBUS0 SCK output 1 low 0
	// ADBUS1 MOSI output 1 low 0
	// ADBUS2 MISO input 0 low 0
	// ADBUS3 NC output 1 low 0
	// ADBUS4 SS output 1 low 0
	// ADBUS5 NC output 1 low 0
	// ADBUS6 CDONE input 0 low 0
	// ADBUS7 CRESET output 1 low 0
	byOutputBuffer[dwNumBytesToSend++] = 0x80;
	// Set data bits low-byte of MPSSE port
	byOutputBuffer[dwNumBytesToSend++] = 0x00;
	// Initial state config above
	byOutputBuffer[dwNumBytesToSend++] = 0xBB;
	// Direction config above
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the low GPIO config commands

	if (ftStatus != FT_OK)
		return false;

	dwNumBytesToSend = 0; // Reset output buffer pointer
	// Set initial states of the MPSSE interface - high byte, both pin directions and output values
	// Pin name Signal Direction Config Initial State Config
	// ACBUS0 GPIOH0 input 0 0
	// ACBUS1 GPIOH1 input 0 0
	// ACBUS2 GPIOH2 input 0 0
	// ACBUS3 GPIOH3 input 0 0
	// ACBUS4 GPIOH4 input 0 0
	// ACBUS5 GPIOH5 input 0 0
	// ACBUS6 GPIOH6 input 0 0
	// ACBUS7 GPIOH7 input 0 0
	byOutputBuffer[dwNumBytesToSend++] = 0x82;
	// Set data bits low-byte of MPSSE port
	byOutputBuffer[dwNumBytesToSend++] = 0x00;
	// Initial state config above
	byOutputBuffer[dwNumBytesToSend++] = 0x00;
	// Direction config above
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the high GPIO config commands

	if (ftStatus != FT_OK)
		return false;

	dwNumBytesToSend = 0; // Reset output buffer pointer
	// Set TCK frequency
	// TCK = 60MHz /((1 + [(1 +0xValueH*256) OR 0xValueL])*2)
	byOutputBuffer[dwNumBytesToSend++] = 0x86;
	//Command to set clock divisor
	byOutputBuffer[dwNumBytesToSend++] = dwClockDivisor & 0xFF;
	//Set 0xValueL of clock divisor
	byOutputBuffer[dwNumBytesToSend++] = (dwClockDivisor >> 8) & 0xFF;
	//Set 0xValueH of clock divisor
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the clock divisor commands

	if (ftStatus != FT_OK)
		return false;

	dwNumBytesToSend = 0; // Reset output buffer pointer
	// Disable internal loop-back
	byOutputBuffer[dwNumBytesToSend++] = 0x85;
	// Disable loopback
	ftStatus = FT_Write(ftHandle, byOutputBuffer, dwNumBytesToSend,
			&dwNumBytesSent);
	// Send off the loopback command

	if (ftStatus != FT_OK)
		return false;

	return true;
}